

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O3

void __thiscall embree::SceneGraph::HairSetNode::convert_bezier_to_bspline(HairSetNode *this)

{
  size_t *psVar1;
  size_t sVar2;
  pointer pHVar3;
  uint uVar4;
  pointer pvVar5;
  ulong uVar6;
  Hair HVar7;
  long lVar8;
  avector<Vec3ff> local_50;
  
  if ((this->type & ~RTC_GEOMETRY_TYPE_QUAD) == RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE) {
    pvVar5 = (this->positions).
             super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->positions).
        super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pvVar5) {
      lVar8 = 0;
      uVar6 = 0;
      do {
        bezier_to_bspline_helper
                  (&local_50,&this->hairs,(avector<Vec3ff> *)(&pvVar5->field_0x0 + lVar8));
        pvVar5 = (this->positions).
                 super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        alignedFree(*(void **)((long)&pvVar5->items + lVar8));
        sVar2 = local_50.size_active;
        local_50.size_active = 0;
        psVar1 = (size_t *)((long)&pvVar5->size_active + lVar8);
        *psVar1 = sVar2;
        psVar1[1] = local_50.size_alloced;
        local_50.size_alloced = 0;
        *(Vec3fx **)((long)&pvVar5->items + lVar8) = local_50.items;
        alignedFree((void *)0x0);
        uVar6 = uVar6 + 1;
        pvVar5 = (this->positions).
                 super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar8 = lVar8 + 0x20;
      } while (uVar6 < (ulong)((long)(this->positions).
                                     super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5 >> 5)
              );
    }
    pHVar3 = (this->hairs).
             super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->hairs).
        super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
        ._M_impl.super__Vector_impl_data._M_finish != pHVar3) {
      uVar4 = 0;
      uVar6 = 0;
      do {
        HVar7.id = 0;
        HVar7.vertex = uVar4;
        pHVar3[uVar6] = HVar7;
        uVar6 = uVar6 + 1;
        pHVar3 = (this->hairs).
                 super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar4 = uVar4 + 4;
      } while (uVar6 < (ulong)((long)(this->hairs).
                                     super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar3 >> 3)
              );
    }
    this->type = this->type == RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE ^
                 RTC_GEOMETRY_TYPE_FLAT_BSPLINE_CURVE;
  }
  return;
}

Assistant:

void SceneGraph::HairSetNode::convert_bezier_to_bspline()
  {
    if (type != RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE &&
        type != RTC_GEOMETRY_TYPE_FLAT_BEZIER_CURVE)
      return;

    for (size_t i=0; i<positions.size(); i++) {
      positions[i] = bezier_to_bspline_helper(hairs,positions[i]);
    }
    for (size_t i=0; i<hairs.size(); i++) {
      hairs[i] = SceneGraph::HairSetNode::Hair(unsigned(4*i),0);
    }

    if (type == RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE)
      type = RTC_GEOMETRY_TYPE_ROUND_BSPLINE_CURVE;
    else
      type = RTC_GEOMETRY_TYPE_FLAT_BSPLINE_CURVE;
  }